

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

optional<supermap::ByteArray<4096UL>_> __thiscall
supermap::Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::getValue
          (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
          Key<128UL> *k)

{
  long *plVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  optional<supermap::ByteArray<4096UL>_> oVar5;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> foundOnDisk;
  undefined8 local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  code *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8 [128];
  _func_int **local_28;
  char local_20;
  
  auVar3 = (**(code **)(**(long **)((k->super_array<unsigned_char,_128UL>)._M_elems + 8) + 8))();
  if ((auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_c8 = 0;
    uStack_c0 = 0;
    local_b0 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_manager;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d0 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_manager;
    (**(code **)**(undefined8 **)((k->super_array<unsigned_char,_128UL>)._M_elems + 0x18))(local_a8)
    ;
    uVar2 = extraout_RDX;
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,3);
      uVar2 = extraout_RDX_00;
    }
    auVar4._8_8_ = uVar2;
    auVar4._0_8_ = local_b8;
    if (local_b8 != (code *)0x0) {
      auVar4 = (*local_b8)(&local_c8,&local_c8,3);
    }
    auVar3._8_8_ = auVar4._8_8_;
    auVar3._0_8_ = local_28;
    if (local_20 == '\0') {
      *(undefined1 *)
       &(this->innerStorage_)._M_t.
        super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        .
        super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
        ._M_head_impl = 0;
      auVar3 = auVar4;
    }
  }
  else {
    local_20 = '\x01';
  }
  uVar2 = auVar3._8_8_;
  if (local_20 != '\0') {
    plVar1 = *(long **)((k->super_array<unsigned_char,_128UL>)._M_elems + 0x10);
    (**(code **)(*plVar1 + 0x20))(local_a8,plVar1,auVar3._0_8_);
    (this->super_KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>).
    _vptr_KeyValueStorage = local_28;
    *(undefined1 *)
     &(this->innerStorage_)._M_t.
      super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
      .
      super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
      ._M_head_impl = 1;
    uVar2 = extraout_RDX_01;
  }
  oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._8_8_ = uVar2;
  oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._M_payload =
       (_Storage<supermap::ByteArray<4096UL>,_false>)this;
  return (optional<supermap::ByteArray<4096UL>_>)
         oVar5.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<4096UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }